

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O1

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessNode
          (MakeLeftHandedProcess *this,aiNode *pNode,aiMatrix4x4 *pParentGlobalRotation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  ulong uVar29;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 local_98;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  (pNode->mTransformation).c1 = -(pNode->mTransformation).c1;
  (pNode->mTransformation).c2 = -(pNode->mTransformation).c2;
  (pNode->mTransformation).c4 = -(pNode->mTransformation).c4;
  (pNode->mTransformation).a3 = -(pNode->mTransformation).a3;
  (pNode->mTransformation).b3 = -(pNode->mTransformation).b3;
  (pNode->mTransformation).d3 = -(pNode->mTransformation).d3;
  if (pNode->mNumChildren != 0) {
    uVar29 = 0;
    do {
      uVar13 = pParentGlobalRotation->a1;
      uVar14 = pParentGlobalRotation->a2;
      uVar15 = pParentGlobalRotation->a3;
      uVar16 = pParentGlobalRotation->a4;
      uVar17 = pParentGlobalRotation->b1;
      uVar18 = pParentGlobalRotation->b2;
      uVar19 = pParentGlobalRotation->b3;
      uVar20 = pParentGlobalRotation->b4;
      uVar21 = pParentGlobalRotation->c1;
      uVar22 = pParentGlobalRotation->c2;
      uVar23 = pParentGlobalRotation->c3;
      uVar24 = pParentGlobalRotation->c4;
      uVar25 = pParentGlobalRotation->d1;
      uVar26 = pParentGlobalRotation->d2;
      uVar27 = pParentGlobalRotation->d3;
      uVar28 = pParentGlobalRotation->d4;
      local_4c = (pNode->mTransformation).b1;
      fVar1 = (pNode->mTransformation).a1;
      local_54 = (pNode->mTransformation).a2;
      fVar2 = (pNode->mTransformation).c1;
      local_50 = (pNode->mTransformation).d1;
      local_2c = local_50 * (float)uVar16 +
                 fVar2 * (float)uVar15 + fVar1 * (float)uVar13 + local_4c * (float)uVar14;
      fVar3 = (pNode->mTransformation).b2;
      fVar4 = (pNode->mTransformation).c2;
      fVar5 = (pNode->mTransformation).d2;
      local_30 = fVar5 * (float)uVar16 +
                 fVar4 * (float)uVar15 + local_54 * (float)uVar13 + (float)uVar14 * fVar3;
      fVar6 = (pNode->mTransformation).b3;
      fVar7 = (pNode->mTransformation).a3;
      fVar8 = (pNode->mTransformation).c3;
      fVar9 = (pNode->mTransformation).d3;
      local_34 = fVar9 * (float)uVar16 +
                 fVar8 * (float)uVar15 + fVar7 * (float)uVar13 + (float)uVar14 * fVar6;
      fVar10 = (pNode->mTransformation).b4;
      fVar11 = (pNode->mTransformation).a4;
      fVar12 = (pNode->mTransformation).c4;
      local_58 = (pNode->mTransformation).d4;
      local_38 = (float)uVar16 * local_58 +
                 (float)uVar15 * fVar12 + (float)uVar13 * fVar11 + (float)uVar14 * fVar10;
      local_3c = local_50 * (float)uVar20 +
                 fVar2 * (float)uVar19 + fVar1 * (float)uVar17 + local_4c * (float)uVar18;
      local_40 = fVar5 * (float)uVar20 +
                 fVar4 * (float)uVar19 + local_54 * (float)uVar17 + fVar3 * (float)uVar18;
      local_44 = fVar9 * (float)uVar20 +
                 fVar8 * (float)uVar19 + fVar7 * (float)uVar17 + fVar6 * (float)uVar18;
      local_48 = local_50 * (float)uVar24 +
                 fVar2 * (float)uVar23 + fVar1 * (float)uVar21 + local_4c * (float)uVar22;
      local_98.a2 = local_30;
      local_98.a1 = local_2c;
      local_98.a4 = local_38;
      local_98.a3 = local_34;
      local_98.b2 = local_40;
      local_98.b1 = local_3c;
      local_98.b4 = (float)uVar20 * local_58 +
                    (float)uVar19 * fVar12 + (float)uVar17 * fVar11 + (float)uVar18 * fVar10;
      local_98.b3 = local_44;
      local_98.c2 = fVar5 * (float)uVar24 +
                    fVar4 * (float)uVar23 + local_54 * (float)uVar21 + fVar3 * (float)uVar22;
      local_98.c1 = local_48;
      local_98.c4 = (float)uVar24 * local_58 +
                    (float)uVar23 * fVar12 + (float)uVar21 * fVar11 + (float)uVar22 * fVar10;
      local_98.c3 = fVar9 * (float)uVar24 +
                    fVar8 * (float)uVar23 + fVar7 * (float)uVar21 + fVar6 * (float)uVar22;
      local_98.d2 = fVar5 * (float)uVar28 +
                    fVar4 * (float)uVar27 + local_54 * (float)uVar25 + fVar3 * (float)uVar26;
      local_98.d1 = local_50 * (float)uVar28 +
                    fVar2 * (float)uVar27 + fVar1 * (float)uVar25 + local_4c * (float)uVar26;
      local_98.d4 = local_58 * (float)uVar28 +
                    fVar12 * (float)uVar27 + fVar11 * (float)uVar25 + fVar10 * (float)uVar26;
      local_98.d3 = fVar9 * (float)uVar28 +
                    fVar8 * (float)uVar27 + fVar7 * (float)uVar25 + fVar6 * (float)uVar26;
      ProcessNode(this,pNode->mChildren[uVar29],&local_98);
      uVar29 = uVar29 + 1;
    } while (uVar29 < pNode->mNumChildren);
  }
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessNode( aiNode* pNode, const aiMatrix4x4& pParentGlobalRotation)
{
    // mirror all base vectors at the local Z axis
    pNode->mTransformation.c1 = -pNode->mTransformation.c1;
    pNode->mTransformation.c2 = -pNode->mTransformation.c2;
    pNode->mTransformation.c3 = -pNode->mTransformation.c3;
    pNode->mTransformation.c4 = -pNode->mTransformation.c4;

    // now invert the Z axis again to keep the matrix determinant positive.
    // The local meshes will be inverted accordingly so that the result should look just fine again.
    pNode->mTransformation.a3 = -pNode->mTransformation.a3;
    pNode->mTransformation.b3 = -pNode->mTransformation.b3;
    pNode->mTransformation.c3 = -pNode->mTransformation.c3;
    pNode->mTransformation.d3 = -pNode->mTransformation.d3; // useless, but anyways...

    // continue for all children
    for( size_t a = 0; a < pNode->mNumChildren; ++a ) {
        ProcessNode( pNode->mChildren[ a ], pParentGlobalRotation * pNode->mTransformation );
    }
}